

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasStringPieceFields(FileDescriptor *file,Options *options)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  
  if (*(int *)(file + 0x2c) < 1) {
    return false;
  }
  lVar3 = 0;
  lVar2 = 0;
  do {
    bVar1 = HasStringPieceFields((Descriptor *)(*(long *)(file + 0x58) + lVar3),options);
    if (bVar1) {
      return bVar1;
    }
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x88;
  } while (lVar2 < *(int *)(file + 0x2c));
  return bVar1;
}

Assistant:

bool HasStringPieceFields(const FileDescriptor* file, const Options& options) {
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (HasStringPieceFields(file->message_type(i), options)) return true;
  }
  return false;
}